

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_index.cpp
# Opt level: O3

int32_t __thiscall cornelich::vanilla_index::find_last_cycle(vanilla_index *this)

{
  pointer pcVar1;
  cycle_formatter *this_00;
  int32_t iVar2;
  int iVar3;
  directory_iterator __begin1;
  directory_iterator __end1;
  directory_iterator end;
  directory_iterator begin;
  error_code err;
  directory_iterator local_a0;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_98;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_90;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_88;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_80;
  directory_iterator local_78;
  iterator_range<boost::filesystem::directory_iterator> local_70;
  string local_60;
  error_code local_40;
  
  boost::system::error_code::error_code(&local_40);
  pcVar1 = (this->m_settings->m_path)._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (this->m_settings->m_path)._M_string_length);
  boost::filesystem::directory_iterator::directory_iterator(&local_78,(path *)&local_60,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_80.px = (dir_itr_imp *)0x0;
  iVar3 = -1;
  if (((local_40.failed_ == false) && (local_78.m_imp.px != (dir_itr_imp *)0x0)) &&
     (*(long *)((long)local_78.m_imp.px + 0x38) != 0)) {
    local_88 = local_78.m_imp.px;
    LOCK();
    *(int *)local_78.m_imp.px = *(int *)local_78.m_imp.px + 1;
    UNLOCK();
    local_90.px = (dir_itr_imp *)0x0;
    local_60._M_dataplus._M_p = (pointer)local_78.m_imp.px;
    if (local_78.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_78.m_imp.px = *(int *)local_78.m_imp.px + 1;
      UNLOCK();
    }
    local_a0.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
    boost::iterator_range<boost::filesystem::directory_iterator>::
    iterator_range<boost::filesystem::directory_iterator>
              (&local_70,(directory_iterator *)&local_60,&local_a0);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_a0.m_imp);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
              ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&local_60);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_90);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_88);
    local_a0.m_imp.px =
         local_70.
         super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
         .m_Begin.m_imp.px;
    if (local_70.
        super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
        .m_Begin.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_70.
              super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
              .m_Begin.m_imp.px =
           *(int *)local_70.
                   super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
                   .m_Begin.m_imp.px + 1;
      UNLOCK();
    }
    local_98 = local_70.
               super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
               .m_End.m_imp.px;
    if (local_70.
        super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
        .m_End.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_70.
              super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
              .m_End.m_imp.px =
           *(int *)local_70.
                   super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
                   .m_End.m_imp.px + 1;
      UNLOCK();
    }
    iVar3 = -1;
    while (local_a0.m_imp.px != (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_98.px)
    {
      if ((local_a0.m_imp.px == (dir_itr_imp *)0x0) ||
         (*(long *)((long)local_a0.m_imp.px + 0x38) == 0)) {
        if ((local_98.px == (dir_itr_imp *)0x0) || (*(long *)(local_98.px + 0x38) == 0)) break;
        if ((local_a0.m_imp.px == (dir_itr_imp *)0x0) ||
           (*(long *)((long)local_a0.m_imp.px + 0x38) == 0)) {
          __assert_fail("(!is_end())&&(\"attempt to dereference end directory iterator\")",
                        "/usr/include/boost/filesystem/directory.hpp",0x140,
                        "boost::iterator_facade<directory_iterator, directory_entry, boost::single_pass_traversal_tag>::reference boost::filesystem::directory_iterator::dereference() const"
                       );
        }
      }
      boost::filesystem::directory_entry::get_status((error_code *)&local_60);
      if ((int)local_60._M_dataplus._M_p == 3) {
        this_00 = (this->m_settings->m_cycle_format).
                  super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        boost::filesystem::path::filename();
        iVar2 = cycle_formatter::cycle_from_date(this_00,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        if (iVar3 <= iVar2) {
          iVar3 = iVar2;
        }
      }
      boost::filesystem::detail::directory_iterator_increment(&local_a0,(error_code *)0x0);
    }
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_98);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_a0.m_imp);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
              (&local_70.
                super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
                .m_End.m_imp);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
              ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&local_70);
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_80);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_78.m_imp);
  return iVar3;
}

Assistant:

std::int32_t vanilla_index::find_last_cycle() const
{
    auto last_cycle = -1;
    boost::system::error_code err;
    fs::directory_iterator begin(m_settings.path(), err);
    fs::directory_iterator end;

    // No directories -> empty
    if(err || begin == end)
        return last_cycle;

    // Find the newest directory
    for(const auto & entry : boost::make_iterator_range(begin, end))
    {
        if(!fs::is_directory(entry))
            continue;
        const auto cycle = m_settings.cycle_format().cycle_from_date(entry.path().filename().string());
        if (last_cycle < cycle)
            last_cycle = cycle;
    }
    return last_cycle;
}